

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O3

void __thiscall gv_visitor::visit(gv_visitor *this,MethodInvocation *ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Expr *second;
  Expressions *second_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_48,"method invocation: ",ptr->name);
  box(this,ptr,&local_48);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  second = ptr->from;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"caller","");
  arrow(this,ptr,second,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (**(ptr->from->super_Base)._vptr_Base)(ptr->from,this);
  second_00 = ptr->args;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"args","");
  arrow(this,ptr,second_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (**(ptr->args->super_Base)._vptr_Base)(ptr->args,this);
  return;
}

Assistant:

void gv_visitor::visit(MethodInvocation* ptr) {
    box(ptr, "method invocation: " + *ptr->name);
    arrow(ptr, ptr->from, "caller");
    ptr->from->accept(this);
    arrow(ptr, ptr->args, "args");
    ptr->args->accept(this);
    //name
}